

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

solution_t solve(deck_t *f,deck_t *s)

{
  size_t *psVar1;
  _Self __tmp_1;
  long *plVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  ulong uVar6;
  _Self __tmp_4;
  uint uVar7;
  _Self __tmp_8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _List_node_base *p_Var9;
  _Self __tmp;
  _List_node_base *p_Var10;
  string local_60;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  uVar7 = 0;
  local_40 = (_List_node_base *)s;
LAB_001024b7:
  paVar8 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"deck 1","");
  dump_deck(&local_60,f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar8) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"deck 2","");
  dump_deck(&local_60,(deck_t *)local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar8) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  p_Var4 = (f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  local_38 = local_40->_M_next;
  while( true ) {
    p_Var9 = local_40;
    if ((*(int *)&p_Var4[1]._M_next < *(int *)&local_38[1]._M_next) ||
       (p_Var9 = (_List_node_base *)f, *(int *)&local_38[1]._M_next < *(int *)&p_Var4[1]._M_next))
    break;
    p_Var10 = (_List_node_base *)f;
    if ((p_Var4->_M_next == (_List_node_base *)f) ||
       (((p_Var4 = (((_List_base<CCard,_std::allocator<CCard>_> *)&p_Var4->_M_next->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next, p_Var4 == (_List_node_base *)f ||
         (p_Var4 = p_Var4->_M_next, p_Var4 == (_List_node_base *)f)) ||
        (p_Var4 = p_Var4->_M_next, p_Var4 == (_List_node_base *)f)))) goto LAB_00102599;
    if ((((local_38->_M_next == local_40) ||
         (p_Var9 = local_38->_M_next->_M_next, p_Var9 == local_40)) ||
        (p_Var9 = p_Var9->_M_next, p_Var9 == local_40)) ||
       (local_38 = p_Var9->_M_next, local_38 == local_40)) goto LAB_0010258c;
  }
  goto LAB_0010259c;
LAB_0010258c:
  local_38 = local_40;
  p_Var10 = p_Var4;
LAB_00102599:
  p_Var9 = (_List_node_base *)0x0;
  p_Var4 = p_Var10;
LAB_0010259c:
  uVar7 = uVar7 + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"turn #",6);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,uVar7);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (p_Var9 != (_List_node_base *)0x0) {
    p_Var10 = (f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node.
              super__List_node_base._M_next;
    while (p_Var10 != p_Var4) {
      p_Var5 = p_Var10->_M_next;
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = p_Var10[1]._M_next;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      p_Var9[1]._M_next = (_List_node_base *)((long)p_Var9[1]._M_next + 1);
      p_Var10 = (f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node.
                super__List_node_base._M_next;
      psVar1 = &(f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var10,0x18);
      p_Var10 = p_Var5;
    }
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = p_Var10[1]._M_next;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    p_Var9[1]._M_next = (_List_node_base *)((long)p_Var9[1]._M_next + 1);
    p_Var4 = (f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    psVar1 = &(f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var4,0x18);
    p_Var10 = local_40;
    p_Var4 = local_40->_M_next;
    p_Var5 = p_Var4;
    if (p_Var4 != local_38) {
      do {
        p_Var4 = p_Var5->_M_next;
        p_Var3 = (_List_node_base *)operator_new(0x18);
        p_Var3[1]._M_next = p_Var5[1]._M_next;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        p_Var9[1]._M_next = (_List_node_base *)((long)p_Var9[1]._M_next + 1);
        p_Var5 = p_Var10->_M_next;
        p_Var10[1]._M_next = (_List_node_base *)((long)p_Var10[1]._M_next + -1);
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var5,0x18);
        p_Var5 = p_Var4;
      } while (p_Var4 != local_38);
    }
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = p_Var4[1]._M_next;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    p_Var9[1]._M_next = (_List_node_base *)((long)p_Var9[1]._M_next + 1);
    p_Var4 = p_Var10->_M_next;
    p_Var10[1]._M_next = (_List_node_base *)((long)p_Var10[1]._M_next + -1);
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var4,0x18);
  }
  if ((f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node.super__List_node_base.
      _M_next == (_List_node_base *)f) {
    uVar6 = 2;
    goto LAB_00102789;
  }
  p_Var4 = (((_List_base<CCard,_std::allocator<CCard>_> *)&local_40->_M_next)->_M_impl)._M_node.
           super__List_node_base._M_next;
  if ((p_Var9 == (_List_node_base *)0x0) || (p_Var4 == local_40)) {
    uVar6 = (ulong)(p_Var4 == local_40);
    if (p_Var4 != local_40) {
      uVar7 = 0;
    }
LAB_00102789:
    return (solution_t)((ulong)uVar7 << 0x20 | uVar6);
  }
  goto LAB_001024b7;
}

Assistant:

solution_t solve(deck_t f, deck_t s)
{
    int turn = 0;
    
    deck_t* winner;
    do
    {
        winner = NULL;

        dump_deck("deck 1", f);
        dump_deck("deck 2", s);

        // take first cards (fight)
        deck_t::const_iterator c1 = f.begin();
        deck_t::const_iterator c2 = s.begin();
            
        do
        {
            if (*c1 < *c2)
            {
                // second have won
                winner = &s;
            }
            else if (*c2 < *c1)
            {
                // first have won
                winner = &f;
            }
            else
            {
                // equal. war is going to start
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
            }
        } while (NULL == winner);
        turn++;
        
        std::cerr << "turn #" << turn << std::endl;

        if (NULL != winner)
        {
            // move card to the winner
            deck_t::iterator i = f.begin();
            while (i != c1)
            {
                winner->push_back(*i++);
                f.pop_front();
            }
            winner->push_back(*i);
            f.pop_front();

            i = s.begin();
            while (i != c2)
            {
                winner->push_back(*i++);
                s.pop_front();
            }
            winner->push_back(*i);
            s.pop_front();
        }
    } while (!f.empty() && !s.empty() && NULL != winner);
    
    if (f.empty())
    {
        return solution_t(2, turn);
    }
    else if (s.empty())
    {
        return solution_t(1, turn);
    }
    else if (NULL == winner)
    {
        return solution_t(0, 0);    // PAT
    }
    else
    {
        throw std::runtime_error("Unexpected exit");
    }
    
    throw std::runtime_error("Wrong logic");
}